

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O2

Vec_Int_t * Io_WriteAigerLiterals(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  Vec_Int_t *p;
  int *piVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = pNtk->vCos->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar4 = iVar5;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  iVar5 = 0;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  for (; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar3->field_0x14 & 0xf) == 8) {
      pAVar3 = Abc_NtkBox(pNtk,iVar5);
      plVar1 = (long *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray];
      iVar4 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[4] * 8) + 0x40);
      Vec_IntPush(p,((uint)(iVar4 == 0) ^ *(uint *)((long)plVar1 + 0x14) >> 10 & 1) + iVar4 * 2);
    }
  }
  for (iVar5 = 0; iVar5 < pNtk->vPos->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkPo(pNtk,iVar5);
    iVar4 = *(int *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x40);
    Vec_IntPush(p,((uint)(iVar4 == 0) ^ *(uint *)&pAVar3->field_0x14 >> 10 & 1) + iVar4 * 2);
  }
  return p;
}

Assistant:

Vec_Int_t * Io_WriteAigerLiterals( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pDriver;
    int i;
    vLits = Vec_IntAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        Vec_IntPush( vLits, Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        Vec_IntPush( vLits, Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    return vLits;
}